

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait.cpp
# Opt level: O2

VOID Sleep(DWORD dwMilliseconds)

{
  PAL_ERROR PVar1;
  CPalThread *pThread;
  PAL_ERROR *pPVar2;
  
  if (PAL_InitializeChakraCoreCalled) {
    pThread = CorUnix::InternalGetCurrentThread();
    PVar1 = CorUnix::InternalSleepEx(pThread,dwMilliseconds,0);
    if (PVar1 == 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) goto LAB_0013c4a0;
    }
    else {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) goto LAB_0013c4a0;
      pPVar2 = (PAL_ERROR *)__errno_location();
      *pPVar2 = PVar1;
    }
    return;
  }
LAB_0013c4a0:
  abort();
}

Assistant:

VOID
PALAPI
Sleep(IN DWORD dwMilliseconds)
{
    PERF_ENTRY(Sleep);
    ENTRY("Sleep(dwMilliseconds=%u)\n", dwMilliseconds);

    CPalThread * pThread = InternalGetCurrentThread();

    PAL_ERROR palErr = InternalSleepEx(pThread, dwMilliseconds, FALSE);

    if (NO_ERROR != palErr)
    {
        ERROR("Sleep(dwMilliseconds=%u) failed [error=%u]\n",
              dwMilliseconds, palErr);
        pThread->SetLastError(palErr);
    }

    LOGEXIT("Sleep returns VOID\n");
    PERF_EXIT(Sleep);
}